

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  
  bVar1 = internal::
          format_decimal<char,unsigned_int,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::no_thousands_sep>
                    (it->container,*(undefined4 *)this,*(undefined4 *)(this + 4));
  it->container = (list<char,_std::allocator<char>_> *)bVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }